

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O1

upb_StringView strviewdup2(upb_ToProto_Context *ctx,upb_StringView str)

{
  upb_Arena *a;
  char *__dest;
  ulong size;
  upb_StringView uVar1;
  
  uVar1.size = str.size;
  a = ctx->arena;
  size = uVar1.size + 7 & 0xfffffffffffffff8;
  __dest = a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)__dest) < size) {
    __dest = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
  }
  else {
    if ((char *)((ulong)(__dest + 7) & 0xfffffffffffffff8) != __dest) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = __dest + size;
  }
  if (__dest != (char *)0x0) {
    memcpy(__dest,str.data,uVar1.size);
    uVar1.data = __dest;
    return uVar1;
  }
  siglongjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static upb_StringView strviewdup2(upb_ToProto_Context* ctx,
                                  upb_StringView str) {
  char* p = upb_Arena_Malloc(ctx->arena, str.size);
  CHK_OOM(p);
  memcpy(p, str.data, str.size);
  return (upb_StringView){.data = p, .size = str.size};
}